

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::GeneratorAction::operator()
          (GeneratorAction *this,cmLocalGenerator *lg,cmListFileBacktrace *lfbt)

{
  _Head_base<0UL,_cmCustomCommand_*,_false> local_10;
  
  if ((this->cc)._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
      _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl == (cmCustomCommand *)0x0) {
    if ((this->Action).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->Action)._M_invoker)((_Any_data *)this,lg,lfbt);
      return;
    }
    __assert_fail("Action",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                  ,0x3aa,
                  "void cmMakefile::GeneratorAction::operator()(cmLocalGenerator &, const cmListFileBacktrace &)"
                 );
  }
  local_10._M_head_impl =
       (this->cc)._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
       ._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
       super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  (this->cc)._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
  .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
  if ((this->CCAction).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->CCAction)._M_invoker)
              ((_Any_data *)&this->CCAction,lg,lfbt,
               (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_10);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_10);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void cmMakefile::GeneratorAction::operator()(cmLocalGenerator& lg,
                                             const cmListFileBacktrace& lfbt)
{
  if (cc) {
    CCAction(lg, lfbt, std::move(cc));
  } else {
    assert(Action);
    Action(lg, lfbt);
  }
}